

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

NTRUEncodeSchedule * ntru_encode_schedule(uint16_t *ms_in,size_t n)

{
  long lVar1;
  uint uVar2;
  NTRUEncodeSchedule *pNVar3;
  uint *ptr;
  uint *puVar4;
  uint32_t *puVar5;
  uint uVar6;
  size_t nnew;
  long lVar7;
  size_t i_1;
  ulong uVar8;
  size_t *allocated;
  size_t i;
  size_t sVar9;
  bool bVar10;
  uint *local_48;
  
  pNVar3 = (NTRUEncodeSchedule *)safemalloc(1,0x28,0);
  pNVar3->nvals = n;
  pNVar3->endpos = n - 1;
  pNVar3->nops = 0;
  pNVar3->opsize = 0;
  pNVar3->ops = (uint32_t *)0x0;
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x272,"NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *, size_t)");
  }
  allocated = &pNVar3->opsize;
  sVar9 = 0;
  ptr = (uint *)safemalloc(n,4,0);
  puVar4 = (uint *)safemalloc(n,4,0);
  do {
    ptr[sVar9] = (uint)ms_in[sVar9];
    sVar9 = sVar9 + 1;
  } while (n != sVar9);
  if (n == 1) {
    bVar10 = false;
    local_48 = puVar4;
  }
  else {
    do {
      local_48 = puVar4;
      puVar4 = ptr;
      uVar8 = 0;
      lVar1 = 0;
      do {
        lVar7 = lVar1;
        if ((uVar8 | 1) == n) {
          puVar5 = (uint32_t *)safegrowarray(pNVar3->ops,allocated,4,pNVar3->nops,1,false);
          pNVar3->ops = puVar5;
          sVar9 = pNVar3->nops;
          pNVar3->nops = sVar9 + 1;
          puVar5[sVar9] = 0;
          pNVar3->endpos = (pNVar3->endpos + 1) % pNVar3->nvals;
          local_48[lVar7] = puVar4[uVar8];
          break;
        }
        uVar2 = puVar4[uVar8 | 1] * puVar4[uVar8];
        uVar6 = puVar4[uVar8] + 2;
        puVar5 = (uint32_t *)safegrowarray(pNVar3->ops,allocated,4,pNVar3->nops,1,false);
        pNVar3->ops = puVar5;
        sVar9 = pNVar3->nops;
        pNVar3->nops = sVar9 + 1;
        puVar5[sVar9] = uVar6 & 0xffff;
        if ((short)uVar6 != 1) {
          pNVar3->endpos = (pNVar3->endpos + 1) % pNVar3->nvals;
        }
        if (0x3fff < uVar2) {
          do {
            puVar5 = (uint32_t *)safegrowarray(pNVar3->ops,allocated,4,pNVar3->nops,1,false);
            pNVar3->ops = puVar5;
            sVar9 = pNVar3->nops;
            pNVar3->nops = sVar9 + 1;
            puVar5[sVar9] = 1;
            uVar6 = uVar2 + 0xff;
            uVar2 = uVar6 >> 8;
          } while (0x3fffff < uVar6);
        }
        local_48[lVar7] = uVar2;
        uVar8 = uVar8 + 2;
        lVar1 = lVar7 + 1;
      } while (uVar8 < n);
      n = lVar7 + 1;
      ptr = local_48;
    } while (1 < n);
    bVar10 = n == 0;
    local_48 = puVar4;
  }
  if (bVar10) {
    __assert_fail("n == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x2b4,"NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *, size_t)");
  }
  uVar2 = *ptr;
  if (1 < uVar2) {
    do {
      puVar5 = (uint32_t *)safegrowarray(pNVar3->ops,allocated,4,pNVar3->nops,1,false);
      pNVar3->ops = puVar5;
      sVar9 = pNVar3->nops;
      pNVar3->nops = sVar9 + 1;
      puVar5[sVar9] = 1;
      uVar6 = uVar2 + 0xff;
      uVar2 = uVar6 >> 8;
    } while (0x1ff < uVar6);
  }
  safefree(ptr);
  safefree(local_48);
  return pNVar3;
}

Assistant:

NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *ms_in, size_t n)
{
    NTRUEncodeSchedule *sched = snew(NTRUEncodeSchedule);
    sched->nvals = n;
    sched->endpos = n-1;
    sched->nops = sched->opsize = 0;
    sched->ops = NULL;

    assert(n != 0);

    /*
     * 'ms' is the list of (m_i) on input to the current pass.
     * 'ms_new' is the list output from the current pass. After each
     * pass we swap the arrays round.
     */
    uint32_t *ms = snewn(n, uint32_t);
    uint32_t *msnew = snewn(n, uint32_t);
    for (size_t i = 0; i < n; i++)
        ms[i] = ms_in[i];

    while (n > 1) {
        size_t nnew = 0;
        for (size_t i = 0; i < n; i += 2) {
            if (i+1 == n) {
                /*
                 * Odd element at the end of the input list: just copy
                 * it unchanged to the output.
                 */
                sched_append(sched, ENC_COPY);
                msnew[nnew++] = ms[i];
                break;
            }

            /*
             * Normal case: consume two elements from the input list
             * and combine them.
             */
            uint32_t m1 = ms[i], m2 = ms[i+1], m = m1*m2;
            sched_append(sched, ENC_COMBINE_BASE + m1);

            /*
             * And then, as long as the combined limit is big enough,
             * emit an output byte from the bottom of it.
             */
            while (m >= (1<<14)) {
                sched_append(sched, ENC_BYTE);
                m = (m + 0xFF) >> 8;
            }

            /*
             * Whatever is left after that, we emit into the output
             * list and append to the fifo.
             */
            msnew[nnew++] = m;
        }

        /*
         * End of pass. The output list of (m_i) now becomes the input
         * list.
         */
        uint32_t *tmp = ms;
        ms = msnew;
        n = nnew;
        msnew = tmp;
    }

    /*
     * When that loop terminates, it's because there's exactly one
     * number left to encode. (Or, technically, _at most_ one - but we
     * don't support encoding a completely empty list in this
     * implementation, because what would be the point?) That number
     * is just emitted little-endian until its limit is 1 (meaning its
     * only possible actual value is 0).
     */
    assert(n == 1);
    uint32_t m = ms[0];
    while (m > 1) {
        sched_append(sched, ENC_BYTE);
        m = (m + 0xFF) >> 8;
    }

    sfree(ms);
    sfree(msnew);

    return sched;
}